

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct64_stage10_sse4_1
               (__m128i *u,__m128i *cospim32,__m128i *cospi32,__m128i *clamp_lo,__m128i *clamp_hi,
               __m128i *rnding,int bit)

{
  longlong in_RCX;
  __m128i *in_RDX;
  __m128i *in_RSI;
  long in_RDI;
  __m128i *in_R8;
  __m128i *out0;
  __m128i *in_R9;
  __m128i *out1;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qa_07;
  undefined8 extraout_XMM0_Qa_08;
  undefined8 extraout_XMM0_Qa_09;
  undefined8 extraout_XMM0_Qa_10;
  undefined8 extraout_XMM0_Qa_11;
  undefined8 extraout_XMM0_Qa_12;
  undefined8 extraout_XMM0_Qa_13;
  undefined8 extraout_XMM0_Qa_14;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  undefined8 extraout_XMM0_Qb_08;
  undefined8 extraout_XMM0_Qb_09;
  undefined8 extraout_XMM0_Qb_10;
  undefined8 extraout_XMM0_Qb_11;
  undefined8 extraout_XMM0_Qb_12;
  undefined8 extraout_XMM0_Qb_13;
  undefined8 extraout_XMM0_Qb_14;
  __m128i in0;
  __m128i in1;
  int in_stack_00000008;
  int i;
  __m128i temp4;
  __m128i temp3;
  __m128i temp2;
  __m128i temp1;
  __m128i *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int iVar1;
  
  out0 = in_R8;
  out1 = in_R9;
  for (iVar1 = 0; iVar1 < 0x10; iVar1 = iVar1 + 1) {
    in0[0] = in_RDI + (long)iVar1 * 0x10;
    in0[1] = in_RDI + (long)(0x1f - iVar1) * 0x10;
    in1[1] = (longlong)in_R8;
    in1[0] = in_RCX;
    addsub_sse4_1(in0,in1,out0,out1,in_stack_ffffffffffffff78,
                  (__m128i *)CONCAT44(iVar1,in_stack_ffffffffffffff80));
  }
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0x280),in_RDX,(__m128i *)(in_RDI + 0x370),in_R9,
                  in_stack_00000008);
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0x290),in_RDX,(__m128i *)(in_RDI + 0x360),in_R9,
                  in_stack_00000008);
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0x2a0),in_RDX,(__m128i *)(in_RDI + 0x350),in_R9,
                  in_stack_00000008);
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0x2b0),in_RDX,(__m128i *)(in_RDI + 0x340),in_R9,
                  in_stack_00000008);
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0x2b0),in_RDX,(__m128i *)(in_RDI + 0x340),in_R9,
                  in_stack_00000008);
  *(undefined8 *)(in_RDI + 0x340) = extraout_XMM0_Qa_03;
  *(undefined8 *)(in_RDI + 0x348) = extraout_XMM0_Qb_03;
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0x2a0),in_RDX,(__m128i *)(in_RDI + 0x350),in_R9,
                  in_stack_00000008);
  *(undefined8 *)(in_RDI + 0x350) = extraout_XMM0_Qa_04;
  *(undefined8 *)(in_RDI + 0x358) = extraout_XMM0_Qb_04;
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0x290),in_RDX,(__m128i *)(in_RDI + 0x360),in_R9,
                  in_stack_00000008);
  *(undefined8 *)(in_RDI + 0x360) = extraout_XMM0_Qa_05;
  *(undefined8 *)(in_RDI + 0x368) = extraout_XMM0_Qb_05;
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0x280),in_RDX,(__m128i *)(in_RDI + 0x370),in_R9,
                  in_stack_00000008);
  *(undefined8 *)(in_RDI + 0x370) = extraout_XMM0_Qa_06;
  *(undefined8 *)(in_RDI + 0x378) = extraout_XMM0_Qb_06;
  *(undefined8 *)(in_RDI + 0x280) = extraout_XMM0_Qa;
  *(undefined8 *)(in_RDI + 0x288) = extraout_XMM0_Qb;
  *(undefined8 *)(in_RDI + 0x290) = extraout_XMM0_Qa_00;
  *(undefined8 *)(in_RDI + 0x298) = extraout_XMM0_Qb_00;
  *(undefined8 *)(in_RDI + 0x2a0) = extraout_XMM0_Qa_01;
  *(undefined8 *)(in_RDI + 0x2a8) = extraout_XMM0_Qb_01;
  *(undefined8 *)(in_RDI + 0x2b0) = extraout_XMM0_Qa_02;
  *(undefined8 *)(in_RDI + 0x2b8) = extraout_XMM0_Qb_02;
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0x2c0),in_RDX,(__m128i *)(in_RDI + 0x330),in_R9,
                  in_stack_00000008);
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0x2d0),in_RDX,(__m128i *)(in_RDI + 800),in_R9,
                  in_stack_00000008);
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0x2e0),in_RDX,(__m128i *)(in_RDI + 0x310),in_R9,
                  in_stack_00000008);
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0x2f0),in_RDX,(__m128i *)(in_RDI + 0x300),in_R9,
                  in_stack_00000008);
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0x2f0),in_RDX,(__m128i *)(in_RDI + 0x300),in_R9,
                  in_stack_00000008);
  *(undefined8 *)(in_RDI + 0x300) = extraout_XMM0_Qa_11;
  *(undefined8 *)(in_RDI + 0x308) = extraout_XMM0_Qb_11;
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0x2e0),in_RDX,(__m128i *)(in_RDI + 0x310),in_R9,
                  in_stack_00000008);
  *(undefined8 *)(in_RDI + 0x310) = extraout_XMM0_Qa_12;
  *(undefined8 *)(in_RDI + 0x318) = extraout_XMM0_Qb_12;
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0x2d0),in_RDX,(__m128i *)(in_RDI + 800),in_R9,
                  in_stack_00000008);
  *(undefined8 *)(in_RDI + 800) = extraout_XMM0_Qa_13;
  *(undefined8 *)(in_RDI + 0x328) = extraout_XMM0_Qb_13;
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0x2c0),in_RDX,(__m128i *)(in_RDI + 0x330),in_R9,
                  in_stack_00000008);
  *(undefined8 *)(in_RDI + 0x330) = extraout_XMM0_Qa_14;
  *(undefined8 *)(in_RDI + 0x338) = extraout_XMM0_Qb_14;
  *(undefined8 *)(in_RDI + 0x2c0) = extraout_XMM0_Qa_07;
  *(undefined8 *)(in_RDI + 0x2c8) = extraout_XMM0_Qb_07;
  *(undefined8 *)(in_RDI + 0x2d0) = extraout_XMM0_Qa_08;
  *(undefined8 *)(in_RDI + 0x2d8) = extraout_XMM0_Qb_08;
  *(undefined8 *)(in_RDI + 0x2e0) = extraout_XMM0_Qa_09;
  *(undefined8 *)(in_RDI + 0x2e8) = extraout_XMM0_Qb_09;
  *(undefined8 *)(in_RDI + 0x2f0) = extraout_XMM0_Qa_10;
  *(undefined8 *)(in_RDI + 0x2f8) = extraout_XMM0_Qb_10;
  return;
}

Assistant:

static inline void idct64_stage10_sse4_1(__m128i *u, const __m128i *cospim32,
                                         const __m128i *cospi32,
                                         const __m128i *clamp_lo,
                                         const __m128i *clamp_hi,
                                         const __m128i *rnding, int bit) {
  __m128i temp1, temp2, temp3, temp4;
  for (int i = 0; i < 16; i++) {
    addsub_sse4_1(u[i], u[31 - i], &u[i], &u[31 - i], clamp_lo, clamp_hi);
  }

  temp1 = half_btf_sse4_1(cospim32, &u[40], cospi32, &u[55], rnding, bit);
  temp2 = half_btf_sse4_1(cospim32, &u[41], cospi32, &u[54], rnding, bit);
  temp3 = half_btf_sse4_1(cospim32, &u[42], cospi32, &u[53], rnding, bit);
  temp4 = half_btf_sse4_1(cospim32, &u[43], cospi32, &u[52], rnding, bit);
  u[52] = half_btf_sse4_1(cospi32, &u[43], cospi32, &u[52], rnding, bit);
  u[53] = half_btf_sse4_1(cospi32, &u[42], cospi32, &u[53], rnding, bit);
  u[54] = half_btf_sse4_1(cospi32, &u[41], cospi32, &u[54], rnding, bit);
  u[55] = half_btf_sse4_1(cospi32, &u[40], cospi32, &u[55], rnding, bit);
  u[40] = temp1;
  u[41] = temp2;
  u[42] = temp3;
  u[43] = temp4;

  temp1 = half_btf_sse4_1(cospim32, &u[44], cospi32, &u[51], rnding, bit);
  temp2 = half_btf_sse4_1(cospim32, &u[45], cospi32, &u[50], rnding, bit);
  temp3 = half_btf_sse4_1(cospim32, &u[46], cospi32, &u[49], rnding, bit);
  temp4 = half_btf_sse4_1(cospim32, &u[47], cospi32, &u[48], rnding, bit);
  u[48] = half_btf_sse4_1(cospi32, &u[47], cospi32, &u[48], rnding, bit);
  u[49] = half_btf_sse4_1(cospi32, &u[46], cospi32, &u[49], rnding, bit);
  u[50] = half_btf_sse4_1(cospi32, &u[45], cospi32, &u[50], rnding, bit);
  u[51] = half_btf_sse4_1(cospi32, &u[44], cospi32, &u[51], rnding, bit);
  u[44] = temp1;
  u[45] = temp2;
  u[46] = temp3;
  u[47] = temp4;
}